

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

void cppjieba::GetWordsFromWordRanges
               (string *s,vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *wrs,
               vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  const_iterator left;
  ulong uVar1;
  size_t this;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *s_00;
  size_type sVar2;
  const_reference pvVar3;
  Word local_58;
  ulong local_28;
  size_t i;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words_local;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *wrs_local;
  string *s_local;
  
  local_28 = 0;
  i = (size_t)words;
  words_local = (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)wrs;
  wrs_local = (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)s;
  while( true ) {
    uVar1 = local_28;
    sVar2 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                      ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                       words_local);
    s_00 = wrs_local;
    this = i;
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                       ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                        words_local,local_28);
    left = pvVar3->left;
    pvVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                       ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                        words_local,local_28);
    GetWordFromRunes(&local_58,(string *)s_00,left,pvVar3->right);
    std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::push_back
              ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)this,&local_58);
    Word::~Word(&local_58);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

inline void GetWordsFromWordRanges(const string& s, const vector<WordRange>& wrs, vector<Word>& words) {
  for (size_t i = 0; i < wrs.size(); i++) {
    words.push_back(GetWordFromRunes(s, wrs[i].left, wrs[i].right));
  }
}